

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecmult_impl.h
# Opt level: O2

void secp256k1_ecmult_strauss_wnaf
               (secp256k1_strauss_state *state,secp256k1_gej *r,size_t num,secp256k1_gej *a,
               secp256k1_scalar *na,secp256k1_scalar *ng)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  ulong uVar4;
  secp256k1_strauss_point_state *psVar5;
  long lVar6;
  secp256k1_fe *psVar7;
  uint uVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  secp256k1_gej *psVar12;
  uint64_t *puVar13;
  secp256k1_gej *psVar14;
  secp256k1_ge *psVar15;
  secp256k1_scalar *a_00;
  long lVar16;
  long lVar17;
  bool bVar18;
  byte bVar19;
  long local_538;
  secp256k1_scalar na_lam;
  secp256k1_fe Z;
  undefined1 local_488 [32];
  undefined1 local_468 [32];
  int wnaf_ng_128 [129];
  int wnaf_ng_1 [129];
  
  bVar19 = 0;
  Z.n[0] = 1;
  Z.n[1] = 0;
  Z.n[2] = 0;
  Z.n[3] = 0;
  Z.n[4] = 0;
  psVar7 = &a->z;
  uVar8 = 0;
  lVar9 = 0;
  a_00 = na;
  while (bVar18 = num != 0, num = num - 1, bVar18) {
    iVar1 = secp256k1_scalar_is_zero(a_00);
    if ((iVar1 == 0) && (*(int *)(psVar7 + 1) == 0)) {
      secp256k1_scalar_split_lambda((secp256k1_scalar *)wnaf_ng_128,&na_lam,a_00);
      iVar1 = secp256k1_ecmult_wnaf
                        (state->ps[lVar9].wnaf_na_1,0x81,(secp256k1_scalar *)wnaf_ng_128,5);
      psVar5 = state->ps;
      psVar5[lVar9].bits_na_1 = iVar1;
      uVar2 = secp256k1_ecmult_wnaf(psVar5[lVar9].wnaf_na_lam,0x81,&na_lam,5);
      psVar5 = state->ps;
      psVar5[lVar9].bits_na_lam = uVar2;
      uVar3 = psVar5[lVar9].bits_na_1;
      if ((int)uVar8 < (int)uVar3) {
        uVar8 = uVar3;
      }
      if ((int)uVar8 < (int)uVar2) {
        uVar8 = uVar2;
      }
      psVar12 = (secp256k1_gej *)(psVar7 + -2);
      psVar14 = (secp256k1_gej *)wnaf_ng_1;
      for (lVar6 = 0x10; lVar6 != 0; lVar6 = lVar6 + -1) {
        (psVar14->x).n[0] = (psVar12->x).n[0];
        psVar12 = (secp256k1_gej *)((long)psVar12 + (ulong)bVar19 * -0x10 + 8);
        psVar14 = (secp256k1_gej *)((long)psVar14 + (ulong)bVar19 * -0x10 + 8);
      }
      if (lVar9 != 0) {
        secp256k1_gej_rescale((secp256k1_gej *)wnaf_ng_1,&Z);
      }
      secp256k1_ecmult_odd_multiples_table
                ((int)lVar9 * 0x2c0 + (int)state->pre_a,(secp256k1_ge *)(state->aux + lVar9 * 8),&Z,
                 (secp256k1_fe *)wnaf_ng_1,(secp256k1_gej *)na);
      if (lVar9 != 0) {
        secp256k1_fe_impl_mul(state->aux + lVar9 * 8,state->aux + lVar9 * 8,psVar7);
      }
      lVar9 = lVar9 + 1;
    }
    a_00 = a_00 + 1;
    psVar7 = (secp256k1_fe *)((long)(psVar7 + 3) + 8);
  }
  if (lVar9 != 0) {
    secp256k1_ge_table_set_globalz(lVar9 * 8,state->pre_a,state->aux);
  }
  lVar6 = 0;
  lVar16 = 0;
  for (lVar17 = 0; lVar17 != lVar9; lVar17 = lVar17 + 1) {
    lVar11 = lVar6;
    for (lVar10 = 0; lVar10 != 0x140; lVar10 = lVar10 + 0x28) {
      secp256k1_fe_impl_mul
                ((secp256k1_fe *)((long)state->aux->n + lVar10 + lVar16),
                 (secp256k1_fe *)((long)(state->pre_a->x).n + lVar11),&secp256k1_const_beta);
      lVar11 = lVar11 + 0x58;
    }
    lVar16 = lVar16 + 0x140;
    lVar6 = lVar6 + 0x2c0;
  }
  if (ng == (secp256k1_scalar *)0x0) {
    uVar3 = 0;
    uVar2 = 0;
  }
  else {
    local_468._0_8_ = ng->d[0];
    local_468._8_8_ = ng->d[1];
    local_468._16_16_ = (undefined1  [16])0x0;
    local_488._0_8_ = ng->d[2];
    local_488._8_8_ = ng->d[3];
    local_488._16_16_ = (undefined1  [16])0x0;
    uVar3 = secp256k1_ecmult_wnaf(wnaf_ng_1,0x81,(secp256k1_scalar *)local_468,0xf);
    psVar7 = (secp256k1_fe *)0xf;
    uVar2 = secp256k1_ecmult_wnaf(wnaf_ng_128,0x81,(secp256k1_scalar *)local_488,0xf);
    if ((int)uVar8 < (int)uVar3) {
      uVar8 = uVar3;
    }
    if ((int)uVar8 < (int)uVar2) {
      uVar8 = uVar2;
    }
  }
  secp256k1_gej_set_infinity(r);
  uVar4 = (ulong)uVar8;
  local_538 = uVar4 * 4;
  while (iVar1 = (int)uVar4, 0 < iVar1) {
    uVar4 = uVar4 - 1;
    secp256k1_gej_double_var(r,r,(secp256k1_fe *)0x0);
    lVar11 = 0x40c;
    lVar17 = 0;
    lVar6 = 0x28;
    lVar16 = lVar9;
    while (bVar18 = lVar16 != 0, lVar16 = lVar16 + -1, bVar18) {
      psVar5 = state->ps;
      if (iVar1 <= *(int *)((long)psVar5->wnaf_na_1 + lVar11 + -4)) {
        uVar8 = *(uint *)((long)psVar5[-1].wnaf_na_1 + local_538 + lVar11);
        psVar7 = (secp256k1_fe *)(ulong)uVar8;
        if (uVar8 != 0) {
          if ((int)uVar8 < 1) {
            puVar13 = (uint64_t *)((long)(&state->pre_a[~uVar8 >> 1].x + -1) + lVar6);
            psVar15 = (secp256k1_ge *)&na_lam;
            for (lVar10 = 0xb; lVar10 != 0; lVar10 = lVar10 + -1) {
              (psVar15->x).n[0] = *puVar13;
              puVar13 = puVar13 + (ulong)bVar19 * -2 + 1;
              psVar15 = (secp256k1_ge *)((long)psVar15 + (ulong)bVar19 * -0x10 + 8);
            }
          }
          else {
            puVar13 = (uint64_t *)((long)(&state->pre_a[uVar8 - 1 >> 1].x + -1) + lVar6);
            psVar15 = (secp256k1_ge *)&na_lam;
            for (lVar10 = 0xb; lVar10 != 0; lVar10 = lVar10 + -1) {
              (psVar15->x).n[0] = *puVar13;
              puVar13 = puVar13 + (ulong)bVar19 * -2 + 1;
              psVar15 = (secp256k1_ge *)((long)psVar15 + (ulong)bVar19 * -0x10 + 8);
            }
          }
          psVar7 = (secp256k1_fe *)0x0;
          secp256k1_gej_add_ge_var(r,r,(secp256k1_ge *)&na_lam,(secp256k1_fe *)0x0);
          psVar5 = state->ps;
        }
      }
      if ((iVar1 <= *(int *)((long)psVar5->wnaf_na_1 + lVar11)) &&
         (uVar8 = *(uint *)((long)psVar5 + lVar11 + -0x20c + local_538), uVar8 != 0)) {
        psVar7 = state->aux;
        if ((int)uVar8 < 1) {
          puVar13 = (uint64_t *)((long)psVar7[~uVar8 >> 1].n + lVar17);
          na_lam.d[0] = *puVar13;
          na_lam.d[1] = puVar13[1];
          puVar13 = (uint64_t *)((long)psVar7[~uVar8 >> 1].n + lVar17 + 0x10);
          na_lam.d[2] = *puVar13;
          na_lam.d[3] = puVar13[1];
        }
        else {
          uVar8 = uVar8 - 1 >> 1;
          puVar13 = (uint64_t *)((long)psVar7[uVar8].n + lVar17);
          na_lam.d[0] = *puVar13;
          na_lam.d[1] = puVar13[1];
          puVar13 = (uint64_t *)((long)psVar7[uVar8].n + lVar17 + 0x10);
          na_lam.d[2] = *puVar13;
          na_lam.d[3] = puVar13[1];
        }
        psVar7 = (secp256k1_fe *)0x0;
        secp256k1_gej_add_ge_var(r,r,(secp256k1_ge *)&na_lam,(secp256k1_fe *)0x0);
      }
      lVar6 = lVar6 + 0x2c0;
      lVar17 = lVar17 + 0x140;
      lVar11 = lVar11 + 0x410;
    }
    if ((iVar1 <= (int)uVar3) && (wnaf_ng_1[uVar4] != 0)) {
      secp256k1_ecmult_table_get_ge_storage
                ((secp256k1_ge *)&na_lam,secp256k1_pre_g,wnaf_ng_1[uVar4],(int)psVar7);
      psVar7 = &Z;
      secp256k1_gej_add_zinv_var(r,r,(secp256k1_ge *)&na_lam,psVar7);
    }
    if ((iVar1 <= (int)uVar2) && (wnaf_ng_128[uVar4] != 0)) {
      secp256k1_ecmult_table_get_ge_storage
                ((secp256k1_ge *)&na_lam,secp256k1_pre_g_128,wnaf_ng_128[uVar4],(int)psVar7);
      psVar7 = &Z;
      secp256k1_gej_add_zinv_var(r,r,(secp256k1_ge *)&na_lam,psVar7);
    }
    local_538 = local_538 + -4;
  }
  if (r->infinity == 0) {
    secp256k1_fe_impl_mul(&r->z,&r->z,&Z);
  }
  return;
}

Assistant:

static void secp256k1_ecmult_strauss_wnaf(const struct secp256k1_strauss_state *state, secp256k1_gej *r, size_t num, const secp256k1_gej *a, const secp256k1_scalar *na, const secp256k1_scalar *ng) {
    secp256k1_ge tmpa;
    secp256k1_fe Z;
    /* Split G factors. */
    secp256k1_scalar ng_1, ng_128;
    int wnaf_ng_1[129];
    int bits_ng_1 = 0;
    int wnaf_ng_128[129];
    int bits_ng_128 = 0;
    int i;
    int bits = 0;
    size_t np;
    size_t no = 0;

    secp256k1_fe_set_int(&Z, 1);
    for (np = 0; np < num; ++np) {
        secp256k1_gej tmp;
        secp256k1_scalar na_1, na_lam;
        if (secp256k1_scalar_is_zero(&na[np]) || secp256k1_gej_is_infinity(&a[np])) {
            continue;
        }
        /* split na into na_1 and na_lam (where na = na_1 + na_lam*lambda, and na_1 and na_lam are ~128 bit) */
        secp256k1_scalar_split_lambda(&na_1, &na_lam, &na[np]);

        /* build wnaf representation for na_1 and na_lam. */
        state->ps[no].bits_na_1   = secp256k1_ecmult_wnaf(state->ps[no].wnaf_na_1,   129, &na_1,   WINDOW_A);
        state->ps[no].bits_na_lam = secp256k1_ecmult_wnaf(state->ps[no].wnaf_na_lam, 129, &na_lam, WINDOW_A);
        VERIFY_CHECK(state->ps[no].bits_na_1 <= 129);
        VERIFY_CHECK(state->ps[no].bits_na_lam <= 129);
        if (state->ps[no].bits_na_1 > bits) {
            bits = state->ps[no].bits_na_1;
        }
        if (state->ps[no].bits_na_lam > bits) {
            bits = state->ps[no].bits_na_lam;
        }

        /* Calculate odd multiples of a.
         * All multiples are brought to the same Z 'denominator', which is stored
         * in Z. Due to secp256k1' isomorphism we can do all operations pretending
         * that the Z coordinate was 1, use affine addition formulae, and correct
         * the Z coordinate of the result once at the end.
         * The exception is the precomputed G table points, which are actually
         * affine. Compared to the base used for other points, they have a Z ratio
         * of 1/Z, so we can use secp256k1_gej_add_zinv_var, which uses the same
         * isomorphism to efficiently add with a known Z inverse.
         */
        tmp = a[np];
        if (no) {
            secp256k1_gej_rescale(&tmp, &Z);
        }
        secp256k1_ecmult_odd_multiples_table(ECMULT_TABLE_SIZE(WINDOW_A), state->pre_a + no * ECMULT_TABLE_SIZE(WINDOW_A), state->aux + no * ECMULT_TABLE_SIZE(WINDOW_A), &Z, &tmp);
        if (no) secp256k1_fe_mul(state->aux + no * ECMULT_TABLE_SIZE(WINDOW_A), state->aux + no * ECMULT_TABLE_SIZE(WINDOW_A), &(a[np].z));

        ++no;
    }

    /* Bring them to the same Z denominator. */
    if (no) {
        secp256k1_ge_table_set_globalz(ECMULT_TABLE_SIZE(WINDOW_A) * no, state->pre_a, state->aux);
    }

    for (np = 0; np < no; ++np) {
        for (i = 0; i < ECMULT_TABLE_SIZE(WINDOW_A); i++) {
            secp256k1_fe_mul(&state->aux[np * ECMULT_TABLE_SIZE(WINDOW_A) + i], &state->pre_a[np * ECMULT_TABLE_SIZE(WINDOW_A) + i].x, &secp256k1_const_beta);
        }
    }

    if (ng) {
        /* split ng into ng_1 and ng_128 (where gn = gn_1 + gn_128*2^128, and gn_1 and gn_128 are ~128 bit) */
        secp256k1_scalar_split_128(&ng_1, &ng_128, ng);

        /* Build wnaf representation for ng_1 and ng_128 */
        bits_ng_1   = secp256k1_ecmult_wnaf(wnaf_ng_1,   129, &ng_1,   WINDOW_G);
        bits_ng_128 = secp256k1_ecmult_wnaf(wnaf_ng_128, 129, &ng_128, WINDOW_G);
        if (bits_ng_1 > bits) {
            bits = bits_ng_1;
        }
        if (bits_ng_128 > bits) {
            bits = bits_ng_128;
        }
    }

    secp256k1_gej_set_infinity(r);

    for (i = bits - 1; i >= 0; i--) {
        int n;
        secp256k1_gej_double_var(r, r, NULL);
        for (np = 0; np < no; ++np) {
            if (i < state->ps[np].bits_na_1 && (n = state->ps[np].wnaf_na_1[i])) {
                secp256k1_ecmult_table_get_ge(&tmpa, state->pre_a + np * ECMULT_TABLE_SIZE(WINDOW_A), n, WINDOW_A);
                secp256k1_gej_add_ge_var(r, r, &tmpa, NULL);
            }
            if (i < state->ps[np].bits_na_lam && (n = state->ps[np].wnaf_na_lam[i])) {
                secp256k1_ecmult_table_get_ge_lambda(&tmpa, state->pre_a + np * ECMULT_TABLE_SIZE(WINDOW_A), state->aux + np * ECMULT_TABLE_SIZE(WINDOW_A), n, WINDOW_A);
                secp256k1_gej_add_ge_var(r, r, &tmpa, NULL);
            }
        }
        if (i < bits_ng_1 && (n = wnaf_ng_1[i])) {
            secp256k1_ecmult_table_get_ge_storage(&tmpa, secp256k1_pre_g, n, WINDOW_G);
            secp256k1_gej_add_zinv_var(r, r, &tmpa, &Z);
        }
        if (i < bits_ng_128 && (n = wnaf_ng_128[i])) {
            secp256k1_ecmult_table_get_ge_storage(&tmpa, secp256k1_pre_g_128, n, WINDOW_G);
            secp256k1_gej_add_zinv_var(r, r, &tmpa, &Z);
        }
    }

    if (!r->infinity) {
        secp256k1_fe_mul(&r->z, &r->z, &Z);
    }
}